

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char **argv_local;
  int argc_local;
  
  bVar1 = ispring::OS::isAdmin();
  if (bVar1) {
    init_hasargoption();
    parse_command(argc,argv);
  }
  else {
    poVar2 = operator<<((ostream *)&std::cout,ispring::xout[0x3c]);
    poVar2 = std::operator<<(poVar2,"cip requires admin privileges to run");
    poVar2 = operator<<(poVar2,ispring::xout[0x37]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = (uint)!bVar1;
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char* argv[]){
    if(!ispring::OS::isAdmin()){
        std::cout << ispring::xout.light_red << "cip requires admin privileges to run" << ispring::xout.white << std::endl;
        return 1;
    }
    init_hasargoption();
	parse_command(argc,argv);
	return 0;
}